

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_mul_mpi(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  mbedtls_mpi_uint *X_00;
  bool bVar1;
  short sVar2;
  int iVar3;
  mbedtls_mpi *X_01;
  size_t A_limbs;
  mbedtls_mpi *X_02;
  size_t B_limbs;
  mbedtls_mpi local_60;
  mbedtls_mpi *local_50;
  ulong local_48;
  undefined1 local_40 [8];
  mbedtls_mpi TB;
  
  local_60.s = 1;
  local_60.n = 0;
  local_60.p = (mbedtls_mpi_uint *)0x0;
  TB.p._0_4_ = 1;
  local_40 = (undefined1  [8])0x0;
  X_02 = A;
  if (X == A) {
    X_02 = &local_60;
    iVar3 = mbedtls_mpi_copy(X_02,A);
    if (iVar3 != 0) goto LAB_0021c15b;
  }
  X_01 = B;
  if (X == B) {
    X_01 = (mbedtls_mpi *)local_40;
    iVar3 = mbedtls_mpi_copy(X_01,B);
    if (iVar3 != 0) goto LAB_0021c15b;
  }
  A_limbs = (size_t)X_02->n;
  bVar1 = true;
  if (A_limbs != 0) {
    do {
      if (X_02->p[A_limbs - 1] != 0) {
        bVar1 = false;
        goto LAB_0021c0fb;
      }
      A_limbs = A_limbs - 1;
    } while (A_limbs != 0);
  }
  A_limbs = 0;
LAB_0021c0fb:
  B_limbs = (size_t)X_01->n;
  local_50 = X_01;
  if (B_limbs == 0) {
    B_limbs = 0;
    local_48 = 0;
  }
  else {
    do {
      if (X_01->p[B_limbs - 1] != 0) goto LAB_0021c121;
      B_limbs = B_limbs - 1;
    } while (B_limbs != 0);
    bVar1 = true;
    B_limbs = 0;
LAB_0021c121:
    local_48 = (ulong)!bVar1;
  }
  iVar3 = mbedtls_mpi_grow(X,B_limbs + A_limbs);
  if ((iVar3 == 0) && (iVar3 = mbedtls_mpi_grow(X,1), iVar3 == 0)) {
    iVar3 = 0;
    memset(X->p,0,(ulong)X->n << 3);
    X_00 = X->p;
    *X_00 = 0;
    X->s = 1;
    mbedtls_mpi_core_mul(X_00,X_02->p,A_limbs,local_50->p,B_limbs);
    sVar2 = 1;
    if ((char)local_48 != '\0') {
      sVar2 = local_50->s * X_02->s;
    }
    X->s = sVar2;
  }
LAB_0021c15b:
  if (local_40 != (undefined1  [8])0x0) {
    mbedtls_zeroize_and_free((void *)local_40,(ulong)TB.p._2_2_ << 3);
  }
  TB.p._0_4_ = 1;
  local_40 = (undefined1  [8])0x0;
  if (local_60.p != (mbedtls_mpi_uint *)0x0) {
    mbedtls_zeroize_and_free(local_60.p,(ulong)local_60.n << 3);
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_mul_mpi(mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j;
    mbedtls_mpi TA, TB;
    int result_is_zero = 0;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(A != NULL);
    MPI_VALIDATE_RET(B != NULL);

    mbedtls_mpi_init(&TA);
    mbedtls_mpi_init(&TB);

    if (X == A) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TA, A)); A = &TA;
    }
    if (X == B) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TB, B)); B = &TB;
    }

    for (i = A->n; i > 0; i--) {
        if (A->p[i - 1] != 0) {
            break;
        }
    }
    if (i == 0) {
        result_is_zero = 1;
    }

    for (j = B->n; j > 0; j--) {
        if (B->p[j - 1] != 0) {
            break;
        }
    }
    if (j == 0) {
        result_is_zero = 1;
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, i + j));
    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 0));

    mbedtls_mpi_core_mul(X->p, A->p, i, B->p, j);

    /* If the result is 0, we don't shortcut the operation, which reduces
     * but does not eliminate side channels leaking the zero-ness. We do
     * need to take care to set the sign bit properly since the library does
     * not fully support an MPI object with a value of 0 and s == -1. */
    if (result_is_zero) {
        X->s = 1;
    } else {
        X->s = A->s * B->s;
    }

cleanup:

    mbedtls_mpi_free(&TB); mbedtls_mpi_free(&TA);

    return ret;
}